

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# url.c
# Opt level: O1

CURLcode set_userpass(connectdata *conn,char *user,char *passwd)

{
  CURLcode CVar1;
  char *pcVar2;
  
  if (((conn->handler->flags & 0x20) == 0) || ((conn->bits).user_passwd != false)) {
    pcVar2 = (*Curl_cstrdup)(user);
    conn->user = pcVar2;
    if (pcVar2 != (char *)0x0) {
      pcVar2 = (*Curl_cstrdup)(passwd);
      goto LAB_0011f246;
    }
  }
  else {
    pcVar2 = (*Curl_cstrdup)("anonymous");
    conn->user = pcVar2;
    if (pcVar2 != (char *)0x0) {
      pcVar2 = (*Curl_cstrdup)("ftp@example.com");
      goto LAB_0011f246;
    }
  }
  pcVar2 = (char *)0x0;
LAB_0011f246:
  conn->passwd = pcVar2;
  if (conn->user == (char *)0x0) {
    CVar1 = CURLE_OUT_OF_MEMORY;
  }
  else {
    CVar1 = CURLE_OUT_OF_MEMORY;
    if (conn->passwd != (char *)0x0) {
      CVar1 = CURLE_OK;
    }
  }
  return CVar1;
}

Assistant:

static CURLcode set_userpass(struct connectdata *conn,
                             const char *user, const char *passwd)
{
  /* If our protocol needs a password and we have none, use the defaults */
  if((conn->handler->flags & PROTOPT_NEEDSPWD) &&
     !conn->bits.user_passwd) {

    conn->user = strdup(CURL_DEFAULT_USER);
    if(conn->user)
      conn->passwd = strdup(CURL_DEFAULT_PASSWORD);
    else
      conn->passwd = NULL;
    /* This is the default password, so DON'T set conn->bits.user_passwd */
  }
  else {
    /* store user + password, zero-length if not set */
    conn->user = strdup(user);
    if(conn->user)
      conn->passwd = strdup(passwd);
    else
      conn->passwd = NULL;
  }
  if(!conn->user || !conn->passwd)
    return CURLE_OUT_OF_MEMORY;

  return CURLE_OK;
}